

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O1

void __thiscall duckdb::LogicalDelete::Serialize(LogicalDelete *this,Serializer *serializer)

{
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_20;
  
  LogicalOperator::Serialize(&this->super_LogicalOperator,serializer);
  (*(this->table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry[8]
  )(&local_20);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>>
            (serializer,200,"table_info",
             (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
             &local_20);
  if (local_20._M_head_impl != (CreateInfo *)0x0) {
    (*((local_20._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  Serializer::WritePropertyWithDefault<unsigned_long>
            (serializer,0xc9,"table_index",&this->table_index);
  Serializer::WritePropertyWithDefault<bool>(serializer,0xca,"return_chunk",&this->return_chunk);
  Serializer::
  WritePropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            (serializer,0xcb,"expressions",&(this->super_LogicalOperator).expressions);
  return;
}

Assistant:

void LogicalDelete::Serialize(Serializer &serializer) const {
	LogicalOperator::Serialize(serializer);
	serializer.WritePropertyWithDefault<unique_ptr<CreateInfo>>(200, "table_info", table.GetInfo());
	serializer.WritePropertyWithDefault<idx_t>(201, "table_index", table_index);
	serializer.WritePropertyWithDefault<bool>(202, "return_chunk", return_chunk);
	serializer.WritePropertyWithDefault<vector<unique_ptr<Expression>>>(203, "expressions", expressions);
}